

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilUtil.c
# Opt level: O1

char * Extra_UtilFileSearch(char *file,char *path,char *mode)

{
  bool bVar1;
  int iVar2;
  char *__ptr;
  char *pcVar3;
  size_t sVar4;
  size_t sVar5;
  char *__s;
  char *pcVar6;
  
  if ((path == (char *)0x0) || (*path == '\0')) {
    path = ".";
  }
  __ptr = Extra_UtilStrsav(path);
  bVar1 = false;
  pcVar6 = __ptr;
  do {
    pcVar3 = strchr(pcVar6,0x3a);
    if (pcVar3 == (char *)0x0) {
      bVar1 = true;
    }
    else {
      *pcVar3 = '\0';
    }
    iVar2 = strcmp(pcVar6,".");
    if (iVar2 == 0) {
      __s = Extra_UtilStrsav(file);
    }
    else {
      sVar4 = strlen(pcVar6);
      sVar5 = strlen(file);
      __s = (char *)malloc(sVar5 + sVar4 + 4);
      sprintf(__s,"%s/%s",pcVar6,file);
    }
    pcVar6 = Extra_UtilStrsav(__s);
    if (__s != (char *)0x0) {
      free(__s);
    }
    iVar2 = Extra_UtilCheckFile(pcVar6,mode);
    if (iVar2 != 0) goto LAB_00420742;
    if (pcVar6 != (char *)0x0) {
      free(pcVar6);
    }
    pcVar6 = pcVar3 + 1;
  } while (!bVar1);
  pcVar6 = (char *)0x0;
LAB_00420742:
  if (__ptr != (char *)0x0) {
    free(__ptr);
  }
  return pcVar6;
}

Assistant:

char * Extra_UtilFileSearch(char *file, char *path, char *mode)
//char *file;			// file we're looking for 
//char *path;			// search path, colon separated 
//char *mode;			// "r", "w", or "x" 
{
    int quit;
    char *buffer, *filename, *save_path, *cp;

    if (path == 0 || strcmp(path, "") == 0) {
	path = ".";		/* just look in the current directory */
    }

    save_path = path = Extra_UtilStrsav(path);
    quit = 0;
    do {
	cp = strchr(path, ':');
	if (cp != 0) {
	    *cp = '\0';
	} else {
	    quit = 1;
	}

	/* cons up the filename out of the path and file name */
	if (strcmp(path, ".") == 0) {
	    buffer = Extra_UtilStrsav(file);
	} else {
	    buffer = ABC_ALLOC(char, strlen(path) + strlen(file) + 4);
	    (void) sprintf(buffer, "%s/%s", path, file);
	}
	filename = Extra_UtilTildeExpand(buffer);
	ABC_FREE(buffer);

	/* see if we can access it */
	if (Extra_UtilCheckFile(filename, mode)) {
	    ABC_FREE(save_path);
	    return filename;
	}
	ABC_FREE(filename);
	path = ++cp;
    } while (! quit); 

    ABC_FREE(save_path);
    return 0;
}